

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O1

void __thiscall miniply::PLYReader::next_element(PLYReader *this)

{
  size_t sVar1;
  pointer pPVar2;
  pointer puVar3;
  pointer puVar4;
  long lVar5;
  double *pdVar6;
  char cVar7;
  short sVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  PLYProperty *prop;
  pointer pPVar12;
  char *pcVar13;
  pointer pPVar14;
  float fVar15;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__c;
  ulong uVar16;
  uint8_t tmp [8];
  double local_48;
  pointer local_40;
  uint local_34;
  
  if ((this->m_valid == true) &&
     (this->m_currentElement <
      (ulong)(((long)(this->m_elements).
                     super__Vector_base<miniply::PLYElement,_std::allocator<miniply::PLYElement>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_elements).
                     super__Vector_base<miniply::PLYElement,_std::allocator<miniply::PLYElement>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7))) {
    sVar1 = this->m_currentElement;
    pPVar2 = (this->m_elements).
             super__Vector_base<miniply::PLYElement,_std::allocator<miniply::PLYElement>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->m_currentElement = sVar1 + 1;
    if (this->m_elementLoaded == true) {
      pPVar12 = pPVar2[sVar1].properties.
                super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar14 = *(pointer *)
                 ((long)&pPVar2[sVar1].properties.
                         super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                         ._M_impl + 8);
      if (pPVar12 != pPVar14) {
        __c = &pPVar12->listData;
        do {
          if (*(int *)((long)(__c + -1) + 0xc) != 8) {
            puVar3 = (__c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((__c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish != puVar3) {
              (__c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish = puVar3;
            }
            if ((__c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage !=
                (__c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::
              __shrink_to_fit_aux<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
              ::_S_do_it(__c);
            }
            puVar4 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1))->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish != puVar4) {
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = puVar4;
            }
            if ((((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage !=
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::
              __shrink_to_fit_aux<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_true>::
              _S_do_it((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1));
            }
          }
          pPVar12 = (pointer)(__c + 2);
          __c = __c + 4;
        } while (pPVar12 != pPVar14);
      }
      puVar3 = (this->m_elementData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_elementData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        (this->m_elementData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar3;
      }
      this->m_elementLoaded = false;
    }
    else if (this->m_fileType == ASCII) {
      if (pPVar2[sVar1].count != 0) {
        uVar11 = 0;
        do {
          next_line(this);
          uVar11 = uVar11 + 1;
        } while (uVar11 < pPVar2[sVar1].count);
      }
    }
    else if (pPVar2[sVar1].fixedSize == true) {
      pcVar13 = this->m_pos +
                ((ulong)(pPVar2[sVar1].count * pPVar2[sVar1].rowStride) - (long)this->m_buf);
      if (0x1ffff < (long)pcVar13) {
        lVar5 = this->m_bufOffset;
        this->m_bufOffset = (int64_t)(pcVar13 + lVar5);
        fseeko((FILE *)this->m_f,(__off_t)(pcVar13 + lVar5),0);
        pcVar13 = this->m_buf + 0x20000;
        this->m_bufEnd = pcVar13;
        this->m_pos = pcVar13;
        this->m_end = pcVar13;
        refill_buffer(this);
        return;
      }
      pcVar13 = this->m_buf + (long)pcVar13;
      this->m_pos = pcVar13;
      this->m_end = pcVar13;
    }
    else if (this->m_fileType == Binary) {
      if (pPVar2[sVar1].count != 0) {
        local_40 = (pointer)((ulong)local_40 & 0xffffffff00000000);
        do {
          pPVar14 = *(pointer *)
                     ((long)&pPVar2[sVar1].properties.
                             super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                             ._M_impl + 8);
          for (pPVar12 = pPVar2[sVar1].properties.
                         super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                         ._M_impl.super__Vector_impl_data._M_start; pPVar12 != pPVar14;
              pPVar12 = pPVar12 + 1) {
            if ((ulong)pPVar12->countType == 8) {
              uVar11 = *(uint *)(kPLYPropertySize + (ulong)pPVar12->type * 4);
              if ((this->m_bufEnd < this->m_pos + uVar11) &&
                 ((bVar9 = refill_buffer(this), !bVar9 || (this->m_bufEnd < this->m_pos + uVar11))))
              goto LAB_00103954;
              pcVar13 = this->m_pos;
              this->m_pos = pcVar13 + uVar11;
              this->m_end = pcVar13 + uVar11;
              iVar10 = 0xb;
            }
            else {
              uVar11 = *(uint *)(kPLYPropertySize + (ulong)pPVar12->countType * 4);
              if ((this->m_pos + uVar11 <= this->m_bufEnd) ||
                 ((bVar9 = refill_buffer(this), bVar9 && (this->m_pos + uVar11 <= this->m_bufEnd))))
              {
                pdVar6 = (double *)this->m_pos;
                switch(pPVar12->countType) {
                case Char:
                  fVar15 = (float)(int)*(char *)pdVar6;
                  break;
                case UChar:
                  fVar15 = (float)(uint)*(byte *)pdVar6;
                  break;
                case Short:
                  fVar15 = (float)(int)*(short *)pdVar6;
                  break;
                case UShort:
                  fVar15 = (float)(uint)*(ushort *)pdVar6;
                  break;
                case Int:
                case UInt:
                  fVar15 = *(float *)pdVar6;
                  break;
                case Float:
                  fVar15 = (float)(int)*(float *)pdVar6;
                  break;
                case Double:
                  fVar15 = (float)(int)*pdVar6;
                  break;
                default:
                  fVar15 = 0.0;
                }
                if ((-1 < (int)fVar15) &&
                   ((uVar16 = (ulong)((int)fVar15 *
                                      *(int *)(kPLYPropertySize + (ulong)pPVar12->type * 4) + uVar11
                                     ), (char *)((long)pdVar6 + uVar16) <= this->m_bufEnd ||
                    ((bVar9 = refill_buffer(this), bVar9 && (this->m_pos + uVar16 <= this->m_bufEnd)
                     ))))) {
                  pcVar13 = this->m_pos;
                  this->m_pos = pcVar13 + uVar16;
                  this->m_end = pcVar13 + uVar16;
                  iVar10 = 0;
                  goto LAB_0010395d;
                }
              }
LAB_00103954:
              this->m_valid = false;
              iVar10 = 1;
            }
LAB_0010395d:
            if ((iVar10 != 0xb) && (iVar10 != 0)) {
              return;
            }
          }
          uVar11 = (int)local_40 + 1;
          local_40 = (pointer)CONCAT44(local_40._4_4_,uVar11);
        } while (uVar11 < pPVar2[sVar1].count);
      }
    }
    else if (pPVar2[sVar1].count != 0) {
      local_34 = 0;
      do {
        pPVar12 = pPVar2[sVar1].properties.
                  super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar14 = *(pointer *)
                   ((long)&pPVar2[sVar1].properties.
                           super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                           ._M_impl + 8);
        local_40 = pPVar14;
        if (pPVar12 != pPVar14) {
          do {
            if ((ulong)pPVar12->countType == 8) {
              uVar11 = *(uint *)(kPLYPropertySize + (ulong)pPVar12->type * 4);
              if ((this->m_pos + uVar11 <= this->m_bufEnd) ||
                 ((bVar9 = refill_buffer(this), bVar9 && (this->m_pos + uVar11 <= this->m_bufEnd))))
              {
                pcVar13 = this->m_pos;
                this->m_pos = pcVar13 + uVar11;
                this->m_end = pcVar13 + uVar11;
                bVar9 = false;
              }
              else {
LAB_00103a56:
                this->m_valid = false;
                bVar9 = true;
              }
            }
            else {
              uVar11 = *(uint *)(kPLYPropertySize + (ulong)pPVar12->countType * 4);
              uVar16 = (ulong)uVar11;
              if ((this->m_bufEnd < this->m_pos + uVar16) &&
                 ((bVar9 = refill_buffer(this), !bVar9 || (this->m_bufEnd < this->m_pos + uVar16))))
              goto LAB_00103a56;
              pcVar13 = this->m_pos;
              memcpy(&local_48,pcVar13,uVar16);
              iVar10 = *(int *)(kPLYPropertySize + (ulong)pPVar12->countType * 4);
              if (iVar10 == 8) {
                local_48 = (double)((ulong)local_48 >> 0x38 |
                                    ((ulong)local_48 & 0xff000000000000) >> 0x28 |
                                    ((ulong)local_48 & 0xff0000000000) >> 0x18 |
                                    ((ulong)local_48 & 0xff00000000) >> 8 |
                                    ((ulong)local_48 & 0xff000000) << 8 |
                                    ((ulong)local_48 & 0xff0000) << 0x18 |
                                    ((ulong)local_48 & 0xff00) << 0x28 | (long)local_48 << 0x38);
              }
              else if (iVar10 == 4) {
                local_48 = (double)CONCAT44(local_48._4_4_,
                                            (uint)local_48._0_4_ >> 0x18 |
                                            ((uint)local_48._0_4_ & 0xff0000) >> 8 |
                                            ((uint)local_48._0_4_ & 0xff00) << 8 |
                                            (int)local_48._0_4_ << 0x18);
              }
              else if (iVar10 == 2) {
                local_48 = (double)CONCAT62(local_48._2_6_,local_48._0_2_ << 8 | local_48._0_2_ >> 8
                                           );
              }
              cVar7 = local_48._0_1_;
              sVar8 = local_48._0_2_;
              switch(pPVar12->countType) {
              case Char:
                fVar15 = (float)(int)cVar7;
                break;
              case UChar:
                fVar15 = (float)((uint)local_48._0_4_ & 0xff);
                break;
              case Short:
                fVar15 = (float)(int)sVar8;
                break;
              case UShort:
                fVar15 = (float)((uint)local_48._0_4_ & 0xffff);
                break;
              case Int:
              case UInt:
                fVar15 = local_48._0_4_;
                break;
              case Float:
                fVar15 = (float)(int)local_48._0_4_;
                break;
              case Double:
                fVar15 = (float)(int)local_48;
                break;
              default:
                fVar15 = 0.0;
              }
              if (((int)fVar15 < 0) ||
                 ((uVar11 = (int)fVar15 * *(int *)(kPLYPropertySize + (ulong)pPVar12->type * 4) +
                            uVar11, this->m_bufEnd < pcVar13 + uVar11 &&
                  ((bVar9 = refill_buffer(this), !bVar9 || (this->m_bufEnd < this->m_pos + uVar11)))
                  ))) {
                this->m_valid = false;
                bVar9 = true;
                pPVar14 = local_40;
              }
              else {
                pcVar13 = this->m_pos;
                this->m_pos = pcVar13 + uVar11;
                this->m_end = pcVar13 + uVar11;
                bVar9 = false;
                pPVar14 = local_40;
              }
            }
            if (bVar9) {
              return;
            }
            pPVar12 = pPVar12 + 1;
          } while (pPVar12 != pPVar14);
        }
        local_34 = local_34 + 1;
      } while (local_34 < pPVar2[sVar1].count);
    }
  }
  return;
}

Assistant:

bool PLYReader::has_element() const
  {
    return m_valid && m_currentElement < m_elements.size();
  }